

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abi_test.h
# Opt level: O0

crypto_word_t
abi_test::internal::CheckImpl<void,unsigned_int*,unsigned_char_const*,unsigned_long>
          (Result *out,bool unwind,_func_void_uint_ptr_uchar_ptr_unsigned_long *func,Type args,
          Type args_1,Type_conflict args_2)

{
  crypto_word_t cVar1;
  crypto_word_t *local_60;
  crypto_word_t local_58;
  crypto_word_t argv [4];
  Type_conflict args_local_2;
  Type args_local_1;
  Type args_local;
  _func_void_uint_ptr_uchar_ptr_unsigned_long *func_local;
  bool unwind_local;
  Result *out_local;
  
  argv[3] = args_2;
  local_58 = ToWord<unsigned_int*>(args);
  argv[0] = ToWord<unsigned_char_const*>(args_1);
  argv[1] = ToWord<unsigned_long>(argv[3]);
  local_60 = argv + 2;
  do {
    *local_60 = 0;
    local_60 = local_60 + 1;
  } while (local_60 != argv + 3);
  cVar1 = RunTrampoline(out,(crypto_word_t)func,&local_58,3,unwind);
  return cVar1;
}

Assistant:

inline crypto_word_t CheckImpl(Result *out, bool unwind, R (*func)(Args...),
                               typename DeductionGuard<Args>::Type... args) {
  // We only support up to 8 arguments, so all arguments on aarch64 are passed
  // in registers. This is simpler and avoids the iOS discrepancy around packing
  // small arguments on the stack. (See the iOS64 reference.)
  static_assert(sizeof...(args) <= 8,
                "too many arguments for abi_test_trampoline");

  // Allocate one extra entry so MSVC does not complain about zero-size arrays.
  crypto_word_t argv[sizeof...(args) + 1] = {
      ToWord(args)...,
  };
  return RunTrampoline(out, reinterpret_cast<crypto_word_t>(func), argv,
                       sizeof...(args), unwind);
}